

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

_Bool Curl_connalive(connectdata *conn)

{
  int iVar1;
  ssize_t sVar2;
  char buf;
  undefined1 local_1;
  
  if ((conn->ssl[0].field_0x10 & 1) == 0) {
    if ((conn->sock[0] != -1) && (sVar2 = recv(conn->sock[0],&local_1,1,2), sVar2 != 0)) {
      return true;
    }
  }
  else {
    iVar1 = Curl_ssl_check_cxn(conn);
    if (iVar1 != 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Curl_connalive(struct connectdata *conn)
{
  /* First determine if ssl */
  if(conn->ssl[FIRSTSOCKET].use) {
    /* use the SSL context */
    if(!Curl_ssl_check_cxn(conn))
      return false;   /* FIN received */
  }
/* Minix 3.1 doesn't support any flags on recv; just assume socket is OK */
#ifdef MSG_PEEK
  else if(conn->sock[FIRSTSOCKET] == CURL_SOCKET_BAD)
    return false;
  else {
    /* use the socket */
    char buf;
    if(recv((RECV_TYPE_ARG1)conn->sock[FIRSTSOCKET], (RECV_TYPE_ARG2)&buf,
            (RECV_TYPE_ARG3)1, (RECV_TYPE_ARG4)MSG_PEEK) == 0) {
      return false;   /* FIN received */
    }
  }
#endif
  return true;
}